

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall QTextCursor::setCharFormat(QTextCursor *this,QTextCharFormat *format)

{
  bool bVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  QTextFormat *unaff_retaddr;
  QTextFormatCollection *in_stack_00000008;
  QTextCursorPrivate *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a54a1);
  if ((!bVar1) &&
     (pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
     pQVar3->priv != (QTextDocumentPrivate *)0x0)) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    iVar4 = pQVar3->position;
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)
                        CONCAT44(iVar4,in_stack_ffffffffffffffe0));
    if (iVar4 == pQVar3->anchor) {
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)
                          CONCAT44(iVar4,in_stack_ffffffffffffffe0));
      QTextDocumentPrivate::formatCollection(pQVar3->priv);
      iVar2 = QTextFormatCollection::indexForFormat(in_stack_00000008,unaff_retaddr);
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)CONCAT44(iVar4,iVar2));
      pQVar3->currentCharFormat = iVar2;
    }
    else {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)CONCAT44(iVar4,in_stack_ffffffffffffffe0)
                );
      QTextCursorPrivate::setCharFormat(in_stack_00000028,(QTextCharFormat *)this,format._4_4_);
    }
  }
  return;
}

Assistant:

void QTextCursor::setCharFormat(const QTextCharFormat &format)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }
    d->setCharFormat(format, QTextDocumentPrivate::SetFormatAndPreserveObjectIndices);
}